

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::toggle_decision_heuristic(Solver *this,bool to_VSIDS)

{
  Heap<Minisat::Solver::VarOrderLt> *this_00;
  vec<int> *ns;
  decision_heuristic dVar1;
  undefined7 in_register_00000031;
  Heap<Minisat::Solver::VarOrderLt> *pHVar2;
  
  if ((int)CONCAT71(in_register_00000031,to_VSIDS) == 0) {
    ns = &(this->order_heap_VSIDS).heap;
    if (this->current_heuristic == VSIDS_CHB) {
      pHVar2 = &this->order_heap_CHB;
      Heap<Minisat::Solver::VarOrderLt>::growTo<Minisat::Solver::VarOrderLt>
                (pHVar2,&this->order_heap_VSIDS);
      Heap<Minisat::Solver::VarOrderLt>::build(pHVar2,ns);
      this->order_heap = pHVar2;
      dVar1 = CHB;
    }
    else {
      pHVar2 = &this->order_heap_DISTANCE;
      Heap<Minisat::Solver::VarOrderLt>::growTo<Minisat::Solver::VarOrderLt>
                (pHVar2,&this->order_heap_VSIDS);
      Heap<Minisat::Solver::VarOrderLt>::build(pHVar2,ns);
      this->order_heap = pHVar2;
      dVar1 = DISTANCE;
    }
  }
  else {
    pHVar2 = &this->order_heap_CHB;
    if (this->current_heuristic == DISTANCE) {
      pHVar2 = &this->order_heap_DISTANCE;
    }
    this_00 = &this->order_heap_VSIDS;
    Heap<Minisat::Solver::VarOrderLt>::growTo<Minisat::Solver::VarOrderLt>(this_00,pHVar2);
    Heap<Minisat::Solver::VarOrderLt>::build(this_00,&pHVar2->heap);
    this->order_heap = this_00;
    dVar1 = (decision_heuristic)(this->current_heuristic != CHB);
  }
  this->current_heuristic = dVar1;
  return;
}

Assistant:

void Solver::toggle_decision_heuristic(bool to_VSIDS)
{
    if (to_VSIDS) { // initialize VSIDS heap again?
        assert(!usesVSIDS() && "should not from VSIDS to itself");
        Heap<VarOrderLt> &currentHeap = usesDISTANCE() ? order_heap_DISTANCE : order_heap_CHB;
        order_heap_VSIDS.growTo(currentHeap);
        order_heap_VSIDS.build(currentHeap.elements());
        order_heap = &order_heap_VSIDS;
        current_heuristic = current_heuristic == CHB ? VSIDS_CHB : VSIDS_DISTANCE;
    } else {
        assert(usesVSIDS() && "should come from VSIDS");
        if (current_heuristic == VSIDS_CHB) {
            order_heap_CHB.growTo(order_heap_VSIDS);
            order_heap_CHB.build(order_heap_VSIDS.elements());
            order_heap = &order_heap_CHB;
            current_heuristic = CHB;
        } else {
            order_heap_DISTANCE.growTo(order_heap_VSIDS);
            order_heap_DISTANCE.build(order_heap_VSIDS.elements());
            order_heap = &order_heap_DISTANCE;
            current_heuristic = DISTANCE;
        }
    }
    assert((trail.size() + order_heap->size()) >= full_heap_size);
}